

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  void *pvVar2;
  size_t sVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  _func_int **pp_Var23;
  undefined8 *puVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  int z;
  int iVar29;
  undefined4 *puVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  _func_int *p_Var37;
  int x_1;
  int iVar38;
  int iVar39;
  undefined8 *puVar40;
  int x_2;
  int x;
  ulong uVar41;
  undefined8 *puVar42;
  uint uVar43;
  long lVar44;
  undefined4 *puVar45;
  long lVar46;
  bool bVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Mat m;
  Mat m_1;
  undefined8 local_58;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  undefined3 uVar16;
  undefined2 uVar18;
  
  p_Var37 = this->_vptr_Padding_x86[-3];
  uVar25 = *(uint *)(&this->field_0xd0 + (long)p_Var37);
  if (((((uVar25 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var37) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var37) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var37) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var37) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var37) == 0)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar20 = bottom_blob->w;
    iVar38 = bottom_blob->h;
    iVar29 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar20;
    top_blob->h = iVar38;
    top_blob->d = iVar29;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  m.elempack = bottom_blob->elempack;
  m.elemsize = bottom_blob->elemsize;
  if ((m.elempack != 0) && (((int)m.elemsize * 8) / m.elempack == 8)) {
    iVar20 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar20;
  }
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar20 = bottom_blob->d;
  uVar26 = bottom_blob->c;
  m.d = bottom_blob->d;
  m.c = bottom_blob->c;
  uVar21 = (ulong)uVar26;
  if (m.elempack == 4) {
    switch(m.dims) {
    case 1:
      uVar25 = *(uint *)(&this->field_0xd8 + (long)p_Var37) + m.w * 4 +
               *(int *)(&this->field_0xdc + (long)p_Var37);
      bVar47 = (uVar25 & 3) == 0;
      if (((*(uint *)(&this->field_0xd8 + (long)p_Var37) & 3) == 0 && bVar47) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var37) == 0)) {
        Mat::create(top_blob,(int)uVar25 >> 2,(m.elemsize >> 2) << bVar47 * '\x02',4,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var37 = this->_vptr_Padding_x86[-3];
        v[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var37);
        v[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var37);
        v[3] = (float)in_XMM1_Db;
        v[2] = (float)in_XMM1_Da;
        padding_constant_pack4_sse
                  (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var37) / 4,
                   *(int *)(&this->field_0xdc + (long)p_Var37) / 4,v);
        return 0;
      }
      break;
    case 2:
      uVar26 = uVar25 + m.h * 4 + *(int *)(&this->field_0xd4 + (long)p_Var37);
      bVar47 = (uVar26 & 3) == 0;
      if (((uVar25 & 3) == 0 && bVar47) && (*(int *)(&this->field_0xe0 + (long)p_Var37) == 0)) {
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var37) +
                             *(int *)(&this->field_0xdc + (long)p_Var37),(int)uVar26 >> 2,
                    (m.elemsize >> 2) << bVar47 * '\x02',4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var37 = this->_vptr_Padding_x86[-3];
        v_02[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var37);
        v_02[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var37);
        v_02[3] = (float)in_XMM1_Db;
        v_02[2] = (float)in_XMM1_Da;
        padding_constant_pack4_sse
                  (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var37) / 4,
                   *(int *)(&this->field_0xd4 + (long)p_Var37) / 4,
                   *(int *)(&this->field_0xd8 + (long)p_Var37),
                   *(int *)(&this->field_0xdc + (long)p_Var37),v_02);
        return 0;
      }
      break;
    case 3:
      uVar43 = *(uint *)(&this->field_0xe8 + (long)p_Var37) + uVar26 * 4 +
               *(int *)(&this->field_0xec + (long)p_Var37);
      bVar47 = (uVar43 & 3) == 0;
      if ((*(uint *)(&this->field_0xe8 + (long)p_Var37) & 3) == 0 && bVar47) {
        if ((uVar43 == uVar26 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var37) == 0)) {
          uVar43 = (int)uVar43 >> 2;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var37) + m.w +
                               *(int *)(&this->field_0xdc + (long)p_Var37),
                      uVar25 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var37),uVar43,
                      (m.elemsize >> 2) << bVar47 * '\x02',4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          uVar21 = (long)*(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]) / -4;
          if ((int)uVar43 < 1) {
            uVar43 = 0;
          }
          uVar31 = uVar21 & 0xffffffff;
          for (uVar28 = 0; uVar28 != uVar43; uVar28 = uVar28 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            m.elemsize = top_blob->elemsize;
            puVar45 = (undefined4 *)(top_blob->cstep * uVar28 * m.elemsize + (long)top_blob->data);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            pp_Var23 = this->_vptr_Padding_x86;
            p_Var37 = pp_Var23[-3];
            if (*(int *)(&this->field_0xf0 + (long)p_Var37) == 0) {
              uVar48 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var37);
              uVar49 = uVar48;
              uVar50 = uVar48;
              uVar51 = uVar48;
            }
            else {
              puVar30 = (undefined4 *)(*(long *)(&this->field_0xf8 + (long)p_Var37) + uVar28 * 0x10)
              ;
              uVar48 = *puVar30;
              uVar49 = puVar30[1];
              uVar50 = puVar30[2];
              uVar51 = puVar30[3];
            }
            uVar25 = (int)uVar21 + (int)uVar28;
            if ((int)uVar25 < 0 || (int)uVar26 <= (int)uVar25) {
              iVar20 = top_blob->d * (int)m.cstep;
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              while (iVar20 != 0) {
                *puVar45 = uVar48;
                puVar45[1] = uVar49;
                puVar45[2] = uVar50;
                puVar45[3] = uVar51;
                puVar45 = puVar45 + 4;
                iVar20 = iVar20 + -1;
              }
            }
            else {
              m_1.w = bottom_blob->w;
              m_1.h = bottom_blob->h;
              m_1.c = bottom_blob->d;
              pvVar2 = bottom_blob->data;
              uVar22 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              puVar30 = (undefined4 *)(uVar25 * sVar3 * uVar22 + (long)pvVar2);
              m_1.allocator = bottom_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.d = 1;
              m_1.dims = bottom_blob->dims + -1;
              m_1.cstep = (uVar22 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar22;
              if (bottom_blob->dims == 4) {
                m_1.cstep = (long)m_1.h * (long)m_1.w;
              }
              iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var37);
              m.data = puVar45;
              m_1.data = puVar30;
              m_1.elemsize = uVar22;
              if (iVar20 == 0) {
                v_00[1] = (float)uVar49;
                v_00[0] = (float)uVar48;
                v_00[3] = (float)in_XMM1_Db;
                v_00[2] = (float)in_XMM1_Da;
                padding_constant_pack4_sse
                          (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var37),
                           *(int *)(&this->field_0xd4 + (long)p_Var37),
                           *(int *)(&this->field_0xd8 + (long)p_Var37),
                           *(int *)(&this->field_0xdc + (long)p_Var37),v_00);
                pp_Var23 = this->_vptr_Padding_x86;
                p_Var37 = pp_Var23[-3];
                iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var37);
              }
              if (iVar20 == 1) {
                iVar38 = 0;
                iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var37);
                if (*(int *)(&this->field_0xd8 + (long)p_Var37) < 1) {
                  iVar20 = 0;
                }
                iVar29 = *(int *)(&this->field_0xdc + (long)p_Var37);
                if (*(int *)(&this->field_0xdc + (long)p_Var37) < 1) {
                  iVar29 = 0;
                }
                iVar39 = *(int *)(&this->field_0xd0 + (long)p_Var37);
                if (*(int *)(&this->field_0xd0 + (long)p_Var37) < 1) {
                  iVar39 = iVar38;
                }
                iVar32 = *(int *)(&this->field_0xd4 + (long)p_Var37);
                for (; iVar38 != iVar39; iVar38 = iVar38 + 1) {
                  uVar48 = *puVar30;
                  uVar49 = puVar30[1];
                  uVar50 = puVar30[2];
                  uVar51 = puVar30[3];
                  iVar35 = iVar20;
                  while (bVar47 = iVar35 != 0, iVar35 = iVar35 + -1, bVar47) {
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar45 = puVar45 + 4;
                  }
                  lVar36 = 0;
                  for (iVar35 = 0; iVar35 < m_1.w; iVar35 = iVar35 + 1) {
                    puVar1 = (undefined4 *)((long)pvVar2 + lVar36 + sVar3 * uVar22 * uVar31);
                    uVar48 = *puVar1;
                    uVar49 = puVar1[1];
                    uVar50 = puVar1[2];
                    uVar51 = puVar1[3];
                    puVar1 = (undefined4 *)((long)puVar45 + lVar36);
                    *puVar1 = uVar48;
                    puVar1[1] = uVar49;
                    puVar1[2] = uVar50;
                    puVar1[3] = uVar51;
                    lVar36 = lVar36 + 0x10;
                  }
                  puVar45 = (undefined4 *)((long)puVar45 + lVar36);
                  iVar35 = iVar29;
                  while (bVar47 = iVar35 != 0, iVar35 = iVar35 + -1, bVar47) {
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar45 = puVar45 + 4;
                  }
                }
                for (iVar38 = 0; iVar38 < m_1.h; iVar38 = iVar38 + 1) {
                  uVar48 = *puVar30;
                  uVar49 = puVar30[1];
                  uVar50 = puVar30[2];
                  uVar51 = puVar30[3];
                  iVar39 = iVar20;
                  while (bVar47 = iVar39 != 0, iVar39 = iVar39 + -1, bVar47) {
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar45 = puVar45 + 4;
                  }
                  for (iVar39 = 0; iVar35 = iVar29, iVar39 < m_1.w; iVar39 = iVar39 + 1) {
                    uVar48 = *puVar30;
                    uVar49 = puVar30[1];
                    uVar50 = puVar30[2];
                    uVar51 = puVar30[3];
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar30 = puVar30 + 4;
                    puVar45 = puVar45 + 4;
                  }
                  while (iVar35 != 0) {
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar45 = puVar45 + 4;
                    iVar35 = iVar35 + -1;
                  }
                }
                puVar30 = puVar30 + -(long)(m_1.w << 2);
                iVar38 = 0;
                if (iVar32 < 1) {
                  iVar32 = iVar38;
                }
                for (; iVar38 != iVar32; iVar38 = iVar38 + 1) {
                  uVar48 = *puVar30;
                  uVar49 = puVar30[1];
                  uVar50 = puVar30[2];
                  uVar51 = puVar30[3];
                  iVar39 = iVar20;
                  while (bVar47 = iVar39 != 0, iVar39 = iVar39 + -1, bVar47) {
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar45 = puVar45 + 4;
                  }
                  lVar36 = 0;
                  for (iVar39 = 0; iVar39 < m_1.w; iVar39 = iVar39 + 1) {
                    puVar1 = (undefined4 *)((long)puVar30 + lVar36);
                    uVar48 = *puVar1;
                    uVar49 = puVar1[1];
                    uVar50 = puVar1[2];
                    uVar51 = puVar1[3];
                    puVar1 = (undefined4 *)((long)puVar45 + lVar36);
                    *puVar1 = uVar48;
                    puVar1[1] = uVar49;
                    puVar1[2] = uVar50;
                    puVar1[3] = uVar51;
                    lVar36 = lVar36 + 0x10;
                  }
                  puVar45 = (undefined4 *)((long)puVar45 + lVar36);
                  iVar39 = iVar29;
                  while (bVar47 = iVar39 != 0, iVar39 = iVar39 + -1, bVar47) {
                    *puVar45 = uVar48;
                    puVar45[1] = uVar49;
                    puVar45[2] = uVar50;
                    puVar45[3] = uVar51;
                    puVar45 = puVar45 + 4;
                  }
                }
                p_Var37 = pp_Var23[-3];
                iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var37);
              }
              if (iVar20 == 2) {
                iVar20 = *(int *)(&this->field_0xd0 + (long)p_Var37);
                uVar25 = *(uint *)(&this->field_0xd8 + (long)p_Var37);
                puVar24 = (undefined8 *)((long)(m_1.w * iVar20 * 4) * 4 + (long)m_1.data);
                uVar41 = 0;
                uVar22 = 0;
                if (0 < (int)uVar25) {
                  uVar22 = (ulong)uVar25;
                }
                uVar33 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var37);
                if ((int)*(uint *)(&this->field_0xdc + (long)p_Var37) < 1) {
                  uVar33 = uVar41;
                }
                iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var37);
                if (iVar20 < 1) {
                  iVar20 = 0;
                }
                lVar36 = (long)(int)uVar25 * 0x10;
                lVar27 = uVar22 * 0x10;
                lVar34 = uVar33 * 0x10;
                puVar40 = (undefined8 *)m.data;
                while( true ) {
                  if ((int)uVar41 == iVar20) break;
                  lVar44 = 0;
                  for (lVar46 = 0; lVar27 + lVar46 != 0; lVar46 = lVar46 + -0x10) {
                    puVar42 = (undefined8 *)((long)puVar24 + lVar46 + lVar36);
                    uVar5 = puVar42[1];
                    *(undefined8 *)((long)puVar40 + lVar44) = *puVar42;
                    ((undefined8 *)((long)puVar40 + lVar44))[1] = uVar5;
                    lVar44 = lVar44 + 0x10;
                  }
                  puVar40 = (undefined8 *)((long)puVar40 - lVar46);
                  lVar44 = -0x20;
                  puVar42 = puVar24;
                  for (iVar29 = 0; iVar29 < m_1.w; iVar29 = iVar29 + 1) {
                    uVar5 = puVar42[1];
                    *puVar40 = *puVar42;
                    puVar40[1] = uVar5;
                    puVar42 = puVar42 + 2;
                    puVar40 = puVar40 + 2;
                  }
                  for (; lVar34 + lVar44 != -0x20; lVar44 = lVar44 + -0x10) {
                    uVar5 = ((undefined8 *)((long)puVar42 + lVar44))[1];
                    *puVar40 = *(undefined8 *)((long)puVar42 + lVar44);
                    puVar40[1] = uVar5;
                    puVar40 = puVar40 + 2;
                  }
                  puVar24 = puVar24 + (long)m_1.w * -2;
                  uVar41 = (ulong)((int)uVar41 + 1);
                }
                for (iVar20 = 0; iVar20 < m_1.h; iVar20 = iVar20 + 1) {
                  lVar46 = 0;
                  for (lVar44 = 0; lVar27 + lVar44 != 0; lVar44 = lVar44 + -0x10) {
                    puVar42 = (undefined8 *)((long)puVar24 + lVar44 + lVar36);
                    uVar5 = puVar42[1];
                    *(undefined8 *)((long)puVar40 + lVar46) = *puVar42;
                    ((undefined8 *)((long)puVar40 + lVar46))[1] = uVar5;
                    lVar46 = lVar46 + 0x10;
                  }
                  puVar40 = (undefined8 *)((long)puVar40 - lVar44);
                  for (iVar29 = 0; lVar44 = -0x20, iVar29 < m_1.w; iVar29 = iVar29 + 1) {
                    uVar5 = puVar24[1];
                    *puVar40 = *puVar24;
                    puVar40[1] = uVar5;
                    puVar24 = puVar24 + 2;
                    puVar40 = puVar40 + 2;
                  }
                  for (; lVar34 + lVar44 != -0x20; lVar44 = lVar44 + -0x10) {
                    uVar5 = ((undefined8 *)((long)puVar24 + lVar44))[1];
                    *puVar40 = *(undefined8 *)((long)puVar24 + lVar44);
                    puVar40[1] = uVar5;
                    puVar40 = puVar40 + 2;
                  }
                }
                puVar24 = puVar24 + (long)m_1.w * -4;
                iVar20 = 0;
                if (iVar38 < 1) {
                  iVar38 = iVar20;
                }
                for (; iVar20 != iVar38; iVar20 = iVar20 + 1) {
                  lVar46 = 0;
                  for (lVar44 = 0; lVar27 + lVar44 != 0; lVar44 = lVar44 + -0x10) {
                    puVar42 = (undefined8 *)((long)puVar24 + lVar44 + lVar36);
                    uVar5 = puVar42[1];
                    *(undefined8 *)((long)puVar40 + lVar46) = *puVar42;
                    ((undefined8 *)((long)puVar40 + lVar46))[1] = uVar5;
                    lVar46 = lVar46 + 0x10;
                  }
                  puVar40 = (undefined8 *)((long)puVar40 - lVar44);
                  puVar42 = puVar24;
                  for (iVar29 = 0; lVar44 = -0x20, iVar29 < m_1.w; iVar29 = iVar29 + 1) {
                    uVar5 = puVar42[1];
                    *puVar40 = *puVar42;
                    puVar40[1] = uVar5;
                    puVar42 = puVar42 + 2;
                    puVar40 = puVar40 + 2;
                  }
                  for (; lVar34 + lVar44 != -0x20; lVar44 = lVar44 + -0x10) {
                    uVar5 = ((undefined8 *)((long)puVar42 + lVar44))[1];
                    *puVar40 = *(undefined8 *)((long)puVar42 + lVar44);
                    puVar40[1] = uVar5;
                    puVar40 = puVar40 + 2;
                  }
                  puVar24 = puVar24 + (long)m_1.w * -2;
                }
              }
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + -1;
                UNLOCK();
                if (*m_1.refcount == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (m.refcount != (int *)0x0) {
                LOCK();
                *m.refcount = *m.refcount + -1;
                UNLOCK();
                if (*m.refcount == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            uVar31 = (ulong)((int)uVar31 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      if (*(int *)(&this->field_0xe0 + (long)p_Var37) == 0) {
        uVar43 = *(int *)(&this->field_0xe8 + (long)p_Var37) + iVar20 +
                 *(int *)(&this->field_0xec + (long)p_Var37);
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var37) +
                             *(int *)(&this->field_0xdc + (long)p_Var37),
                    uVar25 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var37),uVar43,uVar26,
                    m.elemsize,4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar43 < 1) {
          uVar43 = 0;
        }
        if ((int)uVar26 < 1) {
          uVar21 = 0;
        }
        for (uVar28 = 0; uVar28 != uVar21; uVar28 = uVar28 + 1) {
          p_Var37 = this->_vptr_Padding_x86[-3];
          if (*(int *)(&this->field_0xf0 + (long)p_Var37) == 0) {
            uVar48 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var37);
            uVar49 = uVar48;
            uVar50 = uVar48;
            uVar51 = uVar48;
          }
          else {
            puVar45 = (undefined4 *)(*(long *)(&this->field_0xf8 + (long)p_Var37) + uVar28 * 0x10);
            uVar48 = *puVar45;
            uVar49 = puVar45[1];
            uVar50 = puVar45[2];
            uVar51 = puVar45[3];
          }
          for (uVar31 = 0; uVar31 != uVar43; uVar31 = uVar31 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            m.elemsize = top_blob->elemsize;
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)top_blob->data +
                             uVar31 * m.elemsize * m.cstep + top_blob->cstep * uVar28 * m.elemsize);
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            p_Var37 = this->_vptr_Padding_x86[-3];
            uVar25 = (int)uVar31 - *(int *)(&this->field_0xe8 + (long)p_Var37);
            if ((int)uVar25 < 0 || iVar20 <= (int)uVar25) {
              uVar22 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar22 = 0;
              }
              while (iVar38 = (int)uVar22, uVar22 = (ulong)(iVar38 - 1), iVar38 != 0) {
                *(undefined4 *)m.data = uVar48;
                *(undefined4 *)((long)m.data + 4) = uVar49;
                *(undefined4 *)((long)m.data + 8) = uVar50;
                *(undefined4 *)((long)m.data + 0xc) = uVar51;
                m.data = (void *)((long)m.data + 0x10);
              }
            }
            else {
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.allocator = bottom_blob->allocator;
              m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
              m_1.data = (void *)((long)bottom_blob->data +
                                 m_1.cstep * m_1.elemsize * (ulong)uVar25 +
                                 bottom_blob->cstep * uVar28 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.w = bottom_blob->w;
              m_1.dims = 2;
              m_1.d = 1;
              m_1.c = 1;
              v_01[3] = (float)in_XMM1_Db;
              v_01[2] = (float)in_XMM1_Da;
              v_01[0] = (float)uVar48;
              v_01[1] = (float)uVar49;
              padding_constant_pack4_sse
                        (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var37),
                         *(int *)(&this->field_0xd4 + (long)p_Var37),
                         *(int *)(&this->field_0xd8 + (long)p_Var37),
                         *(int *)(&this->field_0xdc + (long)p_Var37),v_01);
            }
          }
        }
        return 0;
      }
    }
  }
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar6 = opt->flush_denormals;
    uVar7 = opt->use_local_pool_allocator;
    uVar9 = opt->use_shader_local_memory;
    uVar11 = opt->use_cooperative_matrix;
    uVar13 = opt->use_winograd23_convolution;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    uVar5._0_1_ = opt->use_winograd43_convolution;
    uVar5._1_1_ = opt->use_winograd63_convolution;
    uVar5._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar5._3_1_ = opt->use_reserved_7;
    uVar14 = opt->use_reserved_8;
    uVar15 = opt->use_reserved_9;
    uVar17 = opt->use_reserved_10;
    uVar19 = opt->use_reserved_11;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar5._4_4_ = CONCAT31(uVar16,uVar14);
    m_1.c = (int)uVar5;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar6;
    m_1.d = uVar8;
    m_1._60_4_ = uVar5._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar20 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),&m,
                            top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}